

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_diag_sse41_128_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  int *piVar25;
  int *piVar26;
  int *piVar27;
  int *piVar28;
  int *piVar29;
  int *piVar30;
  int *piVar31;
  int *piVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  char cVar58;
  char cVar59;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  int8_t *piVar60;
  byte bVar61;
  byte bVar62;
  char cVar63;
  byte bVar67;
  byte bVar68;
  char cVar69;
  byte bVar70;
  byte bVar71;
  char cVar72;
  byte bVar73;
  byte bVar74;
  char cVar75;
  byte bVar76;
  byte bVar77;
  char cVar78;
  byte bVar79;
  byte bVar80;
  char cVar81;
  byte bVar82;
  byte bVar83;
  char cVar84;
  byte bVar85;
  byte bVar86;
  char cVar87;
  byte bVar88;
  byte bVar89;
  char cVar90;
  byte bVar92;
  byte bVar95;
  byte bVar98;
  byte bVar101;
  byte bVar104;
  byte bVar107;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  byte bVar93;
  char cVar94;
  byte bVar96;
  char cVar97;
  byte bVar99;
  char cVar100;
  byte bVar102;
  char cVar103;
  byte bVar105;
  char cVar106;
  byte bVar108;
  char cVar109;
  byte bVar110;
  byte bVar111;
  char cVar112;
  ulong uVar91;
  undefined1 auVar113 [16];
  __m128i vWH_00;
  int local_ab0;
  int local_aac;
  int local_a98;
  int local_a94;
  int local_a80;
  int local_a7c;
  int local_a68;
  int local_a64;
  int local_a50;
  int local_a4c;
  int local_a38;
  int local_a34;
  int local_a20;
  int local_a1c;
  int local_a08;
  int local_a04;
  int local_9f0;
  int local_9ec;
  int local_9d8;
  int local_9d4;
  int local_9c0;
  int local_9bc;
  int local_9a8;
  int local_9a4;
  int local_990;
  int local_98c;
  int local_978;
  int local_974;
  int local_960;
  int local_95c;
  int local_948;
  int local_944;
  int local_900;
  int8_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMax;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_690;
  int8_t score;
  int8_t POS_LIMIT;
  int iStack_68c;
  int8_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int8_t *F_pr;
  int8_t *H_pr;
  int8_t *s2;
  int8_t *_F_pr;
  int8_t *_H_pr;
  int8_t *s2B;
  int8_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [24];
  undefined1 local_5b8 [8];
  undefined1 local_5b0 [24];
  undefined1 local_598 [8];
  undefined1 local_590 [24];
  undefined1 local_578 [8];
  undefined1 local_570 [24];
  undefined1 local_558 [8];
  undefined1 local_550 [88];
  undefined1 local_4f8 [8];
  undefined1 local_4f0 [56];
  undefined1 local_4b8 [8];
  undefined1 local_4b0 [24];
  undefined1 local_498 [8];
  undefined1 local_490 [24];
  undefined1 local_478 [8];
  undefined1 local_470 [24];
  undefined1 local_458 [8];
  undefined1 local_450 [312];
  char local_318;
  char cStack_317;
  char cStack_316;
  char cStack_315;
  char cStack_314;
  char cStack_313;
  char cStack_312;
  char cStack_311;
  char cStack_310;
  char cStack_30f;
  char cStack_30e;
  char cStack_30d;
  char cStack_30c;
  char cStack_30b;
  char cStack_30a;
  char cStack_309;
  char local_2d8;
  char cStack_2d7;
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  char cStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  char cStack_2c9;
  char local_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  char local_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char local_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  char local_298;
  char cStack_297;
  char cStack_296;
  char cStack_295;
  char cStack_294;
  char cStack_293;
  char cStack_292;
  char cStack_291;
  char cStack_290;
  char cStack_28f;
  char cStack_28e;
  char cStack_28d;
  char cStack_28c;
  char cStack_28b;
  char cStack_28a;
  char cStack_289;
  char local_228;
  char cStack_227;
  char cStack_226;
  char cStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  char cStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char local_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  char cStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  char cStack_1c9;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  s2B = (int8_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_diag_sse41_128_8","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_diag_sse41_128_8","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_diag_sse41_128_8","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_diag_sse41_128_8","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_diag_sse41_128_8","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_diag_sse41_128_8","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_diag_sse41_128_8","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_900 = _s1Len;
    if (matrix->type != 0) {
      local_900 = matrix->length;
    }
    iStack_68c = local_900 + -1;
    local_690 = s2Len + -1;
    N._0_1_ = (char)open;
    cVar58 = (char)N;
    if (matrix->min <= -open) {
      cVar58 = -(char)matrix->min;
    }
    cVar58 = cVar58 + -0x7f;
    cVar59 = ((byte)matrix->max ^ 0x7f) - 1;
    local_5d0._0_3_ = CONCAT21(CONCAT11(cVar58,cVar58),cVar58);
    local_5d8._0_3_ = CONCAT21(CONCAT11(cVar58,cVar58),cVar58);
    vNegInf[1] = CONCAT17(cVar58,CONCAT16(cVar58,CONCAT15(cVar58,CONCAT14(cVar58,CONCAT13(cVar58,
                                                  local_5d8._0_3_)))));
    vSaturationCheckMax[0] =
         CONCAT17(cVar58,CONCAT16(cVar58,CONCAT15(cVar58,CONCAT14(cVar58,CONCAT13(cVar58,local_5d0.
                                                                                         _0_3_)))));
    local_5b0._0_3_ = CONCAT21(CONCAT11(cVar59,cVar59),cVar59);
    local_5b8._0_3_ = CONCAT21(CONCAT11(cVar59,cVar59),cVar59);
    vSaturationCheckMax[1] =
         CONCAT17(cVar59,CONCAT16(cVar59,CONCAT15(cVar59,CONCAT14(cVar59,CONCAT13(cVar59,local_5b8.
                                                                                         _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar59,CONCAT16(cVar59,CONCAT15(cVar59,CONCAT14(cVar59,CONCAT13(cVar59,local_5b0.
                                                                                         _0_3_)))));
    local_590._0_3_ = CONCAT21(CONCAT11(cVar58,cVar58),cVar58);
    local_598._0_3_ = CONCAT21(CONCAT11(cVar58,cVar58),cVar58);
    uVar33 = CONCAT17(cVar58,CONCAT16(cVar58,CONCAT15(cVar58,CONCAT14(cVar58,CONCAT13(cVar58,
                                                  local_598._0_3_)))));
    uVar91 = CONCAT17(cVar58,CONCAT16(cVar58,CONCAT15(cVar58,CONCAT14(cVar58,CONCAT13(cVar58,
                                                  local_590._0_3_)))));
    local_570._0_3_ = CONCAT21(CONCAT11((char)N,(char)N),(char)N);
    local_578._0_3_ = CONCAT21(CONCAT11((char)N,(char)N),(char)N);
    uVar34 = CONCAT17((char)N,CONCAT16((char)N,CONCAT15((char)N,CONCAT14((char)N,CONCAT13((char)N,
                                                  local_578._0_3_)))));
    uVar36 = CONCAT17((char)N,CONCAT16((char)N,CONCAT15((char)N,CONCAT14((char)N,CONCAT13((char)N,
                                                  local_570._0_3_)))));
    PAD._0_1_ = (char)gap;
    local_550._0_3_ = CONCAT21(CONCAT11((char)PAD,(char)PAD),(char)PAD);
    local_558._0_3_ = CONCAT21(CONCAT11((char)PAD,(char)PAD),(char)PAD);
    uVar35 = CONCAT17((char)PAD,
                      CONCAT16((char)PAD,
                               CONCAT15((char)PAD,
                                        CONCAT14((char)PAD,CONCAT13((char)PAD,local_558._0_3_)))));
    uVar37 = CONCAT17((char)PAD,
                      CONCAT16((char)PAD,
                               CONCAT15((char)PAD,
                                        CONCAT14((char)PAD,CONCAT13((char)PAD,local_550._0_3_)))));
    local_4f0[2] = (char)PAD * '\x10';
    local_4f0[1] = local_4f0[2];
    local_4f0[0] = local_4f0[2];
    local_4f8[2] = local_4f0[2];
    local_4f8[1] = local_4f0[2];
    local_4f8[0] = local_4f0[2];
    auVar38[3] = local_4f0[2];
    auVar38._0_3_ = local_4f8._0_3_;
    auVar38[4] = local_4f0[2];
    auVar38[5] = local_4f0[2];
    auVar38[6] = local_4f0[2];
    auVar38[7] = local_4f0[2];
    auVar38[0xb] = local_4f0[2];
    auVar38._8_3_ = local_4f0._0_3_;
    auVar38[0xc] = local_4f0[2];
    auVar38[0xd] = local_4f0[2];
    auVar38[0xe] = local_4f0[2];
    auVar38[0xf] = local_4f0[2];
    vI[0] = 0x1020304050607;
    vJreset[1] = 0x8090a0b0c0d0e0f;
    vMax[0] = uVar91;
    vILimit[1] = uVar33;
    s2Len_PAD._0_1_ = (undefined1)local_900;
    local_4b0[2] = (undefined1)s2Len_PAD;
    local_4b0[1] = (undefined1)s2Len_PAD;
    local_4b0[0] = (undefined1)s2Len_PAD;
    local_4b8[2] = (undefined1)s2Len_PAD;
    local_4b8[1] = (undefined1)s2Len_PAD;
    local_4b8[0] = (undefined1)s2Len_PAD;
    auVar44[3] = (undefined1)s2Len_PAD;
    auVar44._0_3_ = local_4b8._0_3_;
    auVar44[4] = (undefined1)s2Len_PAD;
    auVar44[5] = (undefined1)s2Len_PAD;
    auVar44[6] = (undefined1)s2Len_PAD;
    auVar44[7] = (undefined1)s2Len_PAD;
    auVar44[0xb] = (undefined1)s2Len_PAD;
    auVar44._8_3_ = local_4b0._0_3_;
    auVar44[0xc] = (undefined1)s2Len_PAD;
    auVar44[0xd] = (undefined1)s2Len_PAD;
    auVar44[0xe] = (undefined1)s2Len_PAD;
    auVar44[0xf] = (undefined1)s2Len_PAD;
    auVar64._8_8_ = 0x101010101010101;
    auVar64._0_8_ = 0x101010101010101;
    auVar64 = psubsb(auVar44,auVar64);
    gap_local._0_1_ = (undefined1)s2Len;
    local_490[2] = (undefined1)gap_local;
    local_490[1] = (undefined1)gap_local;
    local_490[0] = (undefined1)gap_local;
    local_498[2] = (undefined1)gap_local;
    local_498[1] = (undefined1)gap_local;
    local_498[0] = (undefined1)gap_local;
    auVar66[3] = (undefined1)gap_local;
    auVar66._0_3_ = local_498._0_3_;
    auVar66[4] = (undefined1)gap_local;
    auVar66[5] = (undefined1)gap_local;
    auVar66[6] = (undefined1)gap_local;
    auVar66[7] = (undefined1)gap_local;
    auVar66[0xb] = (undefined1)gap_local;
    auVar66._8_3_ = local_490._0_3_;
    auVar66[0xc] = (undefined1)gap_local;
    auVar66[0xd] = (undefined1)gap_local;
    auVar66[0xe] = (undefined1)gap_local;
    auVar66[0xf] = (undefined1)gap_local;
    auVar65._8_8_ = 0x101010101010101;
    auVar65._0_8_ = 0x101010101010101;
    auVar65 = psubsb(auVar66,auVar65);
    vIBoundary[0]._7_1_ = -(char)N;
    cVar63 = (char)(gap << 2);
    cVar69 = (char)(gap << 3);
    local_450[2] = vIBoundary[0]._7_1_ + (char)PAD * -5;
    local_450[1] = vIBoundary[0]._7_1_ + (char)PAD * -6;
    local_450[0] = ((char)PAD - cVar69) - (char)N;
    local_458[2] = vIBoundary[0]._7_1_ + (char)PAD * -0xd;
    local_458[1] = ((char)PAD * '\x02' - (char)(gap << 4)) - (char)N;
    local_458[0] = vIBoundary[0]._7_1_ + (char)PAD * -0xf;
    vNH[1]._3_1_ = vIBoundary[0]._7_1_ + cVar63 * -3;
    vNH[1]._0_3_ = local_458._0_3_;
    vNH[1]._4_1_ = vIBoundary[0]._7_1_ + (char)PAD * -0xb;
    vNH[1]._5_1_ = vIBoundary[0]._7_1_ + (char)PAD * -10;
    vNH[1]._6_1_ = vIBoundary[0]._7_1_ + (char)PAD * -9;
    vNH[1]._7_1_ = vIBoundary[0]._7_1_ - cVar69;
    vIBoundary[0]._3_1_ = vIBoundary[0]._7_1_ - cVar63;
    vIBoundary[0]._0_3_ = local_450._0_3_;
    vIBoundary[0]._4_1_ = vIBoundary[0]._7_1_ + (char)PAD * -3;
    vIBoundary[0]._5_1_ = vIBoundary[0]._7_1_ + (char)PAD * -2;
    vIBoundary[0]._6_1_ = vIBoundary[0]._7_1_ - (char)PAD;
    _s1_local = (char *)parasail_result_new_rowcol1(local_900,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x10101001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      ptr_01 = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      piVar60 = ptr + 0xf;
      if (ptr == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int8_t(0x10,(long)(local_900 + 0xf));
          if (s2B == (int8_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_900; end_query = end_query + 1) {
            s2B[end_query] = (int8_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_900; end_query < local_900 + 0xf; end_query = end_query + 1) {
            s2B[end_query] = '\0';
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar60[end_ref] = (int8_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -0xf; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar60[end_ref] = '\0';
        }
        while (end_ref = iVar1, end_ref < s2Len + 0xf) {
          piVar60[end_ref] = '\0';
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 0xf] = -((char)end_ref * (char)PAD) - (char)N;
          ptr_01[(long)end_ref + 0xf] = cVar58;
        }
        for (end_ref = -0xf; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 0xf] = cVar58;
          ptr_01[(long)end_ref + 0xf] = cVar58;
        }
        while (end_ref = iVar1, end_ref < s2Len + 0xf) {
          ptr_00[(long)end_ref + 0xf] = cVar58;
          ptr_01[(long)end_ref + 0xf] = cVar58;
          iVar1 = end_ref + 1;
        }
        ptr_00[0xe] = '\0';
        for (end_query = 0; end_query < local_900; end_query = end_query + 0x10) {
          vNH[0] = uVar91;
          vWH[1] = uVar33;
          vWH[0] = uVar91;
          vE[1] = uVar33;
          vE[0] = uVar91;
          vF[1] = uVar33;
          vF[0] = uVar91;
          vJ[1] = uVar33;
          vJ[0] = 0xfffefdfcfbfaf9;
          matrow0 = (int *)0xf8f7f6f5f4f3f2f1;
          piVar17 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_944 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_900) {
              local_948 = end_query;
            }
            else {
              local_948 = local_900 + -1;
            }
            local_944 = local_948;
          }
          piVar18 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_95c = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_900) {
              local_960 = end_query + 1;
            }
            else {
              local_960 = local_900 + -1;
            }
            local_95c = local_960;
          }
          piVar19 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_974 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_900) {
              local_978 = end_query + 2;
            }
            else {
              local_978 = local_900 + -1;
            }
            local_974 = local_978;
          }
          piVar20 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_98c = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_900) {
              local_990 = end_query + 3;
            }
            else {
              local_990 = local_900 + -1;
            }
            local_98c = local_990;
          }
          piVar21 = matrix->matrix;
          iVar5 = matrix->size;
          if (matrix->type == 0) {
            local_9a4 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_900) {
              local_9a8 = end_query + 4;
            }
            else {
              local_9a8 = local_900 + -1;
            }
            local_9a4 = local_9a8;
          }
          piVar22 = matrix->matrix;
          iVar6 = matrix->size;
          if (matrix->type == 0) {
            local_9bc = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_900) {
              local_9c0 = end_query + 5;
            }
            else {
              local_9c0 = local_900 + -1;
            }
            local_9bc = local_9c0;
          }
          piVar23 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_9d4 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_900) {
              local_9d8 = end_query + 6;
            }
            else {
              local_9d8 = local_900 + -1;
            }
            local_9d4 = local_9d8;
          }
          piVar24 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_9ec = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_900) {
              local_9f0 = end_query + 7;
            }
            else {
              local_9f0 = local_900 + -1;
            }
            local_9ec = local_9f0;
          }
          piVar25 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_a04 = (int)s2B[end_query + 8];
          }
          else {
            if (end_query + 8 < local_900) {
              local_a08 = end_query + 8;
            }
            else {
              local_a08 = local_900 + -1;
            }
            local_a04 = local_a08;
          }
          piVar26 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_a1c = (int)s2B[end_query + 9];
          }
          else {
            if (end_query + 9 < local_900) {
              local_a20 = end_query + 9;
            }
            else {
              local_a20 = local_900 + -1;
            }
            local_a1c = local_a20;
          }
          piVar27 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_a34 = (int)s2B[end_query + 10];
          }
          else {
            if (end_query + 10 < local_900) {
              local_a38 = end_query + 10;
            }
            else {
              local_a38 = local_900 + -1;
            }
            local_a34 = local_a38;
          }
          piVar28 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_a4c = (int)s2B[end_query + 0xb];
          }
          else {
            if (end_query + 0xb < local_900) {
              local_a50 = end_query + 0xb;
            }
            else {
              local_a50 = local_900 + -1;
            }
            local_a4c = local_a50;
          }
          piVar29 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_a64 = (int)s2B[end_query + 0xc];
          }
          else {
            if (end_query + 0xc < local_900) {
              local_a68 = end_query + 0xc;
            }
            else {
              local_a68 = local_900 + -1;
            }
            local_a64 = local_a68;
          }
          piVar30 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_a7c = (int)s2B[end_query + 0xd];
          }
          else {
            if (end_query + 0xd < local_900) {
              local_a80 = end_query + 0xd;
            }
            else {
              local_a80 = local_900 + -1;
            }
            local_a7c = local_a80;
          }
          piVar31 = matrix->matrix;
          iVar15 = matrix->size;
          if (matrix->type == 0) {
            local_a94 = (int)s2B[end_query + 0xe];
          }
          else {
            if (end_query + 0xe < local_900) {
              local_a98 = end_query + 0xe;
            }
            else {
              local_a98 = local_900 + -1;
            }
            local_a94 = local_a98;
          }
          piVar32 = matrix->matrix;
          iVar16 = matrix->size;
          if (matrix->type == 0) {
            local_aac = (int)s2B[end_query + 0xf];
          }
          else {
            if (end_query + 0xf < local_900) {
              local_ab0 = end_query + 0xf;
            }
            else {
              local_ab0 = local_900 + -1;
            }
            local_aac = local_ab0;
          }
          vWH[1] = vWH._9_8_;
          vNH[0] = uVar91 >> 8;
          vNH[0] = vNH[0] | (ulong)(byte)ptr_00[0xe] << 0x38;
          vE[1] = vE._9_8_;
          vWH[0] = uVar91 >> 8;
          vWH[0] = vWH[0] | (ulong)(byte)-((char)N + (char)end_query * (char)PAD) << 0x38;
          ptr_00[0xe] = -(((char)end_query + '\x10') * (char)PAD) - (char)N;
          for (end_ref = 0; auVar44 = stack0xfffffffffffff828, auVar66 = stack0xfffffffffffff7f8,
              end_ref < s2Len + 0xf; end_ref = end_ref + 1) {
            stack0xfffffffffffff828 = vE._9_15_;
            vNH[0]._7_1_ = ptr_00[(long)end_ref + 0xf];
            auVar45 = stack0xfffffffffffff828;
            stack0xfffffffffffff7f8 = vJ._9_15_;
            vF[0]._7_1_ = ptr_01[(long)end_ref + 0xf];
            auVar39 = stack0xfffffffffffff7f8;
            vWH[1] = vE._9_8_;
            vNH[0] = auVar45._8_8_;
            auVar43._8_8_ = vNH[0];
            auVar43._0_8_ = vWH[1];
            auVar42._8_8_ = uVar36;
            auVar42._0_8_ = uVar34;
            auVar113 = psubsb(auVar43,auVar42);
            vJ[1] = auVar66._1_8_;
            vF[0] = auVar39._8_8_;
            auVar41._8_8_ = vF[0];
            auVar41._0_8_ = vJ[1];
            auVar40._8_8_ = uVar37;
            auVar40._0_8_ = uVar35;
            auVar66 = psubsb(auVar41,auVar40);
            local_298 = auVar113[0];
            cStack_297 = auVar113[1];
            cStack_296 = auVar113[2];
            cStack_295 = auVar113[3];
            cStack_294 = auVar113[4];
            cStack_293 = auVar113[5];
            cStack_292 = auVar113[6];
            cStack_291 = auVar113[7];
            cStack_290 = auVar113[8];
            cStack_28f = auVar113[9];
            cStack_28e = auVar113[10];
            cStack_28d = auVar113[0xb];
            cStack_28c = auVar113[0xc];
            cStack_28b = auVar113[0xd];
            cStack_28a = auVar113[0xe];
            cStack_289 = auVar113[0xf];
            local_2a8 = auVar66[0];
            cStack_2a7 = auVar66[1];
            cStack_2a6 = auVar66[2];
            cStack_2a5 = auVar66[3];
            cStack_2a4 = auVar66[4];
            cStack_2a3 = auVar66[5];
            cStack_2a2 = auVar66[6];
            cStack_2a1 = auVar66[7];
            cStack_2a0 = auVar66[8];
            cStack_29f = auVar66[9];
            cStack_29e = auVar66[10];
            cStack_29d = auVar66[0xb];
            cStack_29c = auVar66[0xc];
            cStack_29b = auVar66[0xd];
            cStack_29a = auVar66[0xe];
            cStack_299 = auVar66[0xf];
            bVar61 = (local_298 < local_2a8) * local_2a8 | (local_298 >= local_2a8) * local_298;
            bVar67 = (cStack_297 < cStack_2a7) * cStack_2a7 |
                     (cStack_297 >= cStack_2a7) * cStack_297;
            bVar70 = (cStack_296 < cStack_2a6) * cStack_2a6 |
                     (cStack_296 >= cStack_2a6) * cStack_296;
            bVar73 = (cStack_295 < cStack_2a5) * cStack_2a5 |
                     (cStack_295 >= cStack_2a5) * cStack_295;
            bVar76 = (cStack_294 < cStack_2a4) * cStack_2a4 |
                     (cStack_294 >= cStack_2a4) * cStack_294;
            bVar79 = (cStack_293 < cStack_2a3) * cStack_2a3 |
                     (cStack_293 >= cStack_2a3) * cStack_293;
            bVar82 = (cStack_292 < cStack_2a2) * cStack_2a2 |
                     (cStack_292 >= cStack_2a2) * cStack_292;
            bVar85 = (cStack_291 < cStack_2a1) * cStack_2a1 |
                     (cStack_291 >= cStack_2a1) * cStack_291;
            bVar88 = (cStack_290 < cStack_2a0) * cStack_2a0 |
                     (cStack_290 >= cStack_2a0) * cStack_290;
            bVar92 = (cStack_28f < cStack_29f) * cStack_29f |
                     (cStack_28f >= cStack_29f) * cStack_28f;
            bVar95 = (cStack_28e < cStack_29e) * cStack_29e |
                     (cStack_28e >= cStack_29e) * cStack_28e;
            bVar98 = (cStack_28d < cStack_29d) * cStack_29d |
                     (cStack_28d >= cStack_29d) * cStack_28d;
            bVar101 = (cStack_28c < cStack_29c) * cStack_29c |
                      (cStack_28c >= cStack_29c) * cStack_28c;
            bVar104 = (cStack_28b < cStack_29b) * cStack_29b |
                      (cStack_28b >= cStack_29b) * cStack_28b;
            bVar107 = (cStack_28a < cStack_29a) * cStack_29a |
                      (cStack_28a >= cStack_29a) * cStack_28a;
            bVar110 = (cStack_289 < cStack_299) * cStack_299 |
                      (cStack_289 >= cStack_299) * cStack_289;
            vJ[1] = CONCAT17(bVar85,CONCAT16(bVar82,CONCAT15(bVar79,CONCAT14(bVar76,CONCAT13(bVar73,
                                                  CONCAT12(bVar70,CONCAT11(bVar67,bVar61)))))));
            vF[0]._0_1_ = bVar88;
            vF[0]._1_1_ = bVar92;
            vF[0]._2_1_ = bVar95;
            vF[0]._3_1_ = bVar98;
            vF[0]._4_1_ = bVar101;
            vF[0]._5_1_ = bVar104;
            vF[0]._6_1_ = bVar107;
            vF[0]._7_1_ = bVar110;
            auVar113._8_8_ = uVar36;
            auVar113._0_8_ = uVar34;
            auVar113 = psubsb(stack0xfffffffffffff818,auVar113);
            auVar39._8_8_ = uVar37;
            auVar39._0_8_ = uVar35;
            auVar66 = psubsb(stack0xfffffffffffff808,auVar39);
            local_2b8 = auVar113[0];
            cStack_2b7 = auVar113[1];
            cStack_2b6 = auVar113[2];
            cStack_2b5 = auVar113[3];
            cStack_2b4 = auVar113[4];
            cStack_2b3 = auVar113[5];
            cStack_2b2 = auVar113[6];
            cStack_2b1 = auVar113[7];
            cStack_2b0 = auVar113[8];
            cStack_2af = auVar113[9];
            cStack_2ae = auVar113[10];
            cStack_2ad = auVar113[0xb];
            cStack_2ac = auVar113[0xc];
            cStack_2ab = auVar113[0xd];
            cStack_2aa = auVar113[0xe];
            cStack_2a9 = auVar113[0xf];
            local_2c8 = auVar66[0];
            cStack_2c7 = auVar66[1];
            cStack_2c6 = auVar66[2];
            cStack_2c5 = auVar66[3];
            cStack_2c4 = auVar66[4];
            cStack_2c3 = auVar66[5];
            cStack_2c2 = auVar66[6];
            cStack_2c1 = auVar66[7];
            cStack_2c0 = auVar66[8];
            cStack_2bf = auVar66[9];
            cStack_2be = auVar66[10];
            cStack_2bd = auVar66[0xb];
            cStack_2bc = auVar66[0xc];
            cStack_2bb = auVar66[0xd];
            cStack_2ba = auVar66[0xe];
            cStack_2b9 = auVar66[0xf];
            bVar62 = (local_2b8 < local_2c8) * local_2c8 | (local_2b8 >= local_2c8) * local_2b8;
            bVar68 = (cStack_2b7 < cStack_2c7) * cStack_2c7 |
                     (cStack_2b7 >= cStack_2c7) * cStack_2b7;
            bVar71 = (cStack_2b6 < cStack_2c6) * cStack_2c6 |
                     (cStack_2b6 >= cStack_2c6) * cStack_2b6;
            bVar74 = (cStack_2b5 < cStack_2c5) * cStack_2c5 |
                     (cStack_2b5 >= cStack_2c5) * cStack_2b5;
            bVar77 = (cStack_2b4 < cStack_2c4) * cStack_2c4 |
                     (cStack_2b4 >= cStack_2c4) * cStack_2b4;
            bVar80 = (cStack_2b3 < cStack_2c3) * cStack_2c3 |
                     (cStack_2b3 >= cStack_2c3) * cStack_2b3;
            bVar83 = (cStack_2b2 < cStack_2c2) * cStack_2c2 |
                     (cStack_2b2 >= cStack_2c2) * cStack_2b2;
            bVar86 = (cStack_2b1 < cStack_2c1) * cStack_2c1 |
                     (cStack_2b1 >= cStack_2c1) * cStack_2b1;
            bVar89 = (cStack_2b0 < cStack_2c0) * cStack_2c0 |
                     (cStack_2b0 >= cStack_2c0) * cStack_2b0;
            bVar93 = (cStack_2af < cStack_2bf) * cStack_2bf |
                     (cStack_2af >= cStack_2bf) * cStack_2af;
            bVar96 = (cStack_2ae < cStack_2be) * cStack_2be |
                     (cStack_2ae >= cStack_2be) * cStack_2ae;
            bVar99 = (cStack_2ad < cStack_2bd) * cStack_2bd |
                     (cStack_2ad >= cStack_2bd) * cStack_2ad;
            bVar102 = (cStack_2ac < cStack_2bc) * cStack_2bc |
                      (cStack_2ac >= cStack_2bc) * cStack_2ac;
            bVar105 = (cStack_2ab < cStack_2bb) * cStack_2bb |
                      (cStack_2ab >= cStack_2bb) * cStack_2ab;
            bVar108 = (cStack_2aa < cStack_2ba) * cStack_2ba |
                      (cStack_2aa >= cStack_2ba) * cStack_2aa;
            bVar111 = (cStack_2a9 < cStack_2b9) * cStack_2b9 |
                      (cStack_2a9 >= cStack_2b9) * cStack_2a9;
            vF[1] = CONCAT17(bVar86,CONCAT16(bVar83,CONCAT15(bVar80,CONCAT14(bVar77,CONCAT13(bVar74,
                                                  CONCAT12(bVar71,CONCAT11(bVar68,bVar62)))))));
            vE[0]._0_1_ = bVar89;
            vE[0]._1_1_ = bVar93;
            vE[0]._2_1_ = bVar96;
            vE[0]._3_1_ = bVar99;
            vE[0]._4_1_ = bVar102;
            vE[0]._5_1_ = bVar105;
            vE[0]._6_1_ = bVar108;
            vE[0]._7_1_ = bVar111;
            local_470[2] = (char)piVar22[(long)(iVar6 * local_9bc) + (long)piVar60[end_ref + -5]];
            local_470[1] = (char)piVar23[(long)(iVar7 * local_9d4) + (long)piVar60[end_ref + -6]];
            local_470[0] = (char)piVar24[(long)(iVar8 * local_9ec) + (long)piVar60[end_ref + -7]];
            local_478[2] = (char)piVar30[(long)(iVar14 * local_a7c) + (long)piVar60[end_ref + -0xd]]
            ;
            local_478[1] = (char)(piVar31 + iVar15 * local_a94)[piVar60[end_ref + -0xe]];
            local_478[0] = (char)piVar32[(long)(iVar16 * local_aac) + (long)piVar60[end_ref + -0xf]]
            ;
            auVar47[3] = (char)piVar29[(long)(iVar13 * local_a64) + (long)piVar60[end_ref + -0xc]];
            auVar47._0_3_ = local_478._0_3_;
            auVar47[4] = (char)piVar28[(long)(iVar12 * local_a4c) + (long)piVar60[end_ref + -0xb]];
            auVar47[5] = (char)piVar27[(long)(iVar11 * local_a34) + (long)piVar60[end_ref + -10]];
            auVar47[6] = (char)piVar26[(long)(iVar10 * local_a1c) + (long)piVar60[end_ref + -9]];
            auVar47[7] = (char)piVar25[(long)(iVar9 * local_a04) + (long)piVar60[end_ref + -8]];
            auVar47[0xb] = (char)piVar21[(long)(iVar5 * local_9a4) + (long)piVar60[end_ref + -4]];
            auVar47._8_3_ = local_470._0_3_;
            auVar47[0xc] = (char)piVar20[(long)(iVar4 * local_98c) + (long)piVar60[end_ref + -3]];
            auVar47[0xd] = (char)piVar19[(long)(iVar3 * local_974) + (long)piVar60[end_ref + -2]];
            auVar47[0xe] = (char)piVar18[(long)(iVar2 * local_95c) + (long)piVar60[end_ref + -1]];
            auVar47[0xf] = (char)piVar17[(long)(iVar1 * local_944) + (long)piVar60[end_ref]];
            auVar66 = paddsb(auVar44,auVar47);
            local_2d8 = auVar66[0];
            cStack_2d7 = auVar66[1];
            cStack_2d6 = auVar66[2];
            cStack_2d5 = auVar66[3];
            cStack_2d4 = auVar66[4];
            cStack_2d3 = auVar66[5];
            cStack_2d2 = auVar66[6];
            cStack_2d1 = auVar66[7];
            cStack_2d0 = auVar66[8];
            cStack_2cf = auVar66[9];
            cStack_2ce = auVar66[10];
            cStack_2cd = auVar66[0xb];
            cStack_2cc = auVar66[0xc];
            cStack_2cb = auVar66[0xd];
            cStack_2ca = auVar66[0xe];
            cStack_2c9 = auVar66[0xf];
            bVar62 = (local_2d8 < (char)bVar62) * bVar62 | (local_2d8 >= (char)bVar62) * local_2d8;
            bVar68 = (cStack_2d7 < (char)bVar68) * bVar68 |
                     (cStack_2d7 >= (char)bVar68) * cStack_2d7;
            bVar71 = (cStack_2d6 < (char)bVar71) * bVar71 |
                     (cStack_2d6 >= (char)bVar71) * cStack_2d6;
            bVar74 = (cStack_2d5 < (char)bVar74) * bVar74 |
                     (cStack_2d5 >= (char)bVar74) * cStack_2d5;
            bVar77 = (cStack_2d4 < (char)bVar77) * bVar77 |
                     (cStack_2d4 >= (char)bVar77) * cStack_2d4;
            bVar80 = (cStack_2d3 < (char)bVar80) * bVar80 |
                     (cStack_2d3 >= (char)bVar80) * cStack_2d3;
            bVar83 = (cStack_2d2 < (char)bVar83) * bVar83 |
                     (cStack_2d2 >= (char)bVar83) * cStack_2d2;
            bVar86 = (cStack_2d1 < (char)bVar86) * bVar86 |
                     (cStack_2d1 >= (char)bVar86) * cStack_2d1;
            bVar89 = (cStack_2d0 < (char)bVar89) * bVar89 |
                     (cStack_2d0 >= (char)bVar89) * cStack_2d0;
            bVar93 = (cStack_2cf < (char)bVar93) * bVar93 |
                     (cStack_2cf >= (char)bVar93) * cStack_2cf;
            bVar96 = (cStack_2ce < (char)bVar96) * bVar96 |
                     (cStack_2ce >= (char)bVar96) * cStack_2ce;
            bVar99 = (cStack_2cd < (char)bVar99) * bVar99 |
                     (cStack_2cd >= (char)bVar99) * cStack_2cd;
            bVar102 = (cStack_2cc < (char)bVar102) * bVar102 |
                      (cStack_2cc >= (char)bVar102) * cStack_2cc;
            bVar105 = (cStack_2cb < (char)bVar105) * bVar105 |
                      (cStack_2cb >= (char)bVar105) * cStack_2cb;
            bVar108 = (cStack_2ca < (char)bVar108) * bVar108 |
                      (cStack_2ca >= (char)bVar108) * cStack_2ca;
            bVar111 = (cStack_2c9 < (char)bVar111) * bVar111 |
                      (cStack_2c9 >= (char)bVar111) * cStack_2c9;
            vE[1] = CONCAT17(((char)bVar86 < (char)bVar85) * bVar85 |
                             ((char)bVar86 >= (char)bVar85) * bVar86,
                             CONCAT16(((char)bVar83 < (char)bVar82) * bVar82 |
                                      ((char)bVar83 >= (char)bVar82) * bVar83,
                                      CONCAT15(((char)bVar80 < (char)bVar79) * bVar79 |
                                               ((char)bVar80 >= (char)bVar79) * bVar80,
                                               CONCAT14(((char)bVar77 < (char)bVar76) * bVar76 |
                                                        ((char)bVar77 >= (char)bVar76) * bVar77,
                                                        CONCAT13(((char)bVar74 < (char)bVar73) *
                                                                 bVar73 | ((char)bVar74 >=
                                                                          (char)bVar73) * bVar74,
                                                                 CONCAT12(((char)bVar71 <
                                                                          (char)bVar70) * bVar70 |
                                                                          ((char)bVar71 >=
                                                                          (char)bVar70) * bVar71,
                                                                          CONCAT11(((char)bVar68 <
                                                                                   (char)bVar67) *
                                                                                   bVar67 | ((char)
                                                  bVar68 >= (char)bVar67) * bVar68,
                                                  ((char)bVar62 < (char)bVar61) * bVar61 |
                                                  ((char)bVar62 >= (char)bVar61) * bVar62)))))));
            vWH[0]._0_1_ = ((char)bVar89 < (char)bVar88) * bVar88 |
                           ((char)bVar89 >= (char)bVar88) * bVar89;
            vWH[0]._1_1_ = ((char)bVar93 < (char)bVar92) * bVar92 |
                           ((char)bVar93 >= (char)bVar92) * bVar93;
            vWH[0]._2_1_ = ((char)bVar96 < (char)bVar95) * bVar95 |
                           ((char)bVar96 >= (char)bVar95) * bVar96;
            vWH[0]._3_1_ = ((char)bVar99 < (char)bVar98) * bVar98 |
                           ((char)bVar99 >= (char)bVar98) * bVar99;
            vWH[0]._4_1_ = ((char)bVar102 < (char)bVar101) * bVar101 |
                           ((char)bVar102 >= (char)bVar101) * bVar102;
            vWH[0]._5_1_ = ((char)bVar105 < (char)bVar104) * bVar104 |
                           ((char)bVar105 >= (char)bVar104) * bVar105;
            vWH[0]._6_1_ = ((char)bVar108 < (char)bVar107) * bVar107 |
                           ((char)bVar108 >= (char)bVar107) * bVar108;
            vWH[0]._7_1_ = ((char)bVar111 < (char)bVar110) * bVar110 |
                           ((char)bVar111 >= (char)bVar110) * bVar111;
            local_1d8 = (char)matrow0;
            cStack_1d7 = matrow0._1_1_;
            cStack_1d6 = matrow0._2_1_;
            cStack_1d5 = matrow0._3_1_;
            cStack_1d4 = matrow0._4_1_;
            cStack_1d3 = matrow0._5_1_;
            cStack_1d2 = matrow0._6_1_;
            cStack_1d1 = matrow0._7_1_;
            cStack_1d0 = matrow0._8_1_;
            cStack_1cf = matrow0._9_1_;
            cStack_1ce = matrow0._10_1_;
            cStack_1cd = matrow0._11_1_;
            cStack_1cc = matrow0._12_1_;
            cStack_1cb = matrow0._13_1_;
            cStack_1ca = matrow0._14_1_;
            cStack_1c9 = matrow0._15_1_;
            cVar63 = -(local_1d8 == -1);
            cVar69 = -(cStack_1d7 == -1);
            cVar72 = -(cStack_1d6 == -1);
            cVar75 = -(cStack_1d5 == -1);
            cVar78 = -(cStack_1d4 == -1);
            cVar81 = -(cStack_1d3 == -1);
            cVar84 = -(cStack_1d2 == -1);
            cVar87 = -(cStack_1d1 == -1);
            cVar90 = -(cStack_1d0 == -1);
            cVar94 = -(cStack_1cf == -1);
            cVar97 = -(cStack_1ce == -1);
            cVar100 = -(cStack_1cd == -1);
            cVar103 = -(cStack_1cc == -1);
            cVar106 = -(cStack_1cb == -1);
            cVar109 = -(cStack_1ca == -1);
            cVar112 = -(cStack_1c9 == -1);
            auVar55[1] = cVar69;
            auVar55[0] = cVar63;
            auVar55[2] = cVar72;
            auVar55[3] = cVar75;
            auVar55[4] = cVar78;
            auVar55[5] = cVar81;
            auVar55[6] = cVar84;
            auVar55[7] = cVar87;
            auVar55[9] = cVar94;
            auVar55[8] = cVar90;
            auVar55[10] = cVar97;
            auVar55[0xb] = cVar100;
            auVar55[0xc] = cVar103;
            auVar55[0xd] = cVar106;
            auVar55[0xe] = cVar109;
            auVar55[0xf] = cVar112;
            auVar56._8_8_ = vWH[0];
            auVar56._0_8_ = vE[1];
            register0x00001240 = pblendvb(auVar56,stack0xfffffffffffff838,auVar55);
            auVar52[1] = cVar69;
            auVar52[0] = cVar63;
            auVar52[2] = cVar72;
            auVar52[3] = cVar75;
            auVar52[4] = cVar78;
            auVar52[5] = cVar81;
            auVar52[6] = cVar84;
            auVar52[7] = cVar87;
            auVar52[9] = cVar94;
            auVar52[8] = cVar90;
            auVar52[10] = cVar97;
            auVar52[0xb] = cVar100;
            auVar52[0xc] = cVar103;
            auVar52[0xd] = cVar106;
            auVar52[0xe] = cVar109;
            auVar52[0xf] = cVar112;
            auVar54._8_8_ = vF[0];
            auVar54._0_8_ = vJ[1];
            auVar53._8_8_ = uVar91;
            auVar53._0_8_ = uVar33;
            register0x00001240 = pblendvb(auVar54,auVar53,auVar52);
            auVar49[1] = cVar69;
            auVar49[0] = cVar63;
            auVar49[2] = cVar72;
            auVar49[3] = cVar75;
            auVar49[4] = cVar78;
            auVar49[5] = cVar81;
            auVar49[6] = cVar84;
            auVar49[7] = cVar87;
            auVar49[9] = cVar94;
            auVar49[8] = cVar90;
            auVar49[10] = cVar97;
            auVar49[0xb] = cVar100;
            auVar49[0xc] = cVar103;
            auVar49[0xd] = cVar106;
            auVar49[0xe] = cVar109;
            auVar49[0xf] = cVar112;
            auVar51._8_8_ = vE[0];
            auVar51._0_8_ = vF[1];
            auVar50._8_8_ = uVar91;
            auVar50._0_8_ = uVar33;
            register0x00001240 = pblendvb(auVar51,auVar50,auVar49);
            if (0xf < end_ref) {
              local_f8 = (char)vSaturationCheckMax[1];
              cStack_f7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
              cStack_f6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
              cStack_f5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
              cStack_f4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
              cStack_f3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
              cStack_f2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
              cStack_f1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
              cStack_f0 = (char)vSaturationCheckMin[0];
              cStack_ef = (char)((ulong)vSaturationCheckMin[0] >> 8);
              cStack_ee = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
              cStack_ed = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
              cStack_ec = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
              cStack_eb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
              cStack_ea = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
              cStack_e9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
              cStack_107 = vE[1]._1_1_;
              cStack_106 = vE[1]._2_1_;
              cStack_105 = vE[1]._3_1_;
              cStack_104 = vE[1]._4_1_;
              cStack_103 = vE[1]._5_1_;
              cStack_102 = vE[1]._6_1_;
              cStack_101 = vE[1]._7_1_;
              cStack_100 = (char)vE[2];
              cStack_ff = vE[2]._1_1_;
              cStack_fe = vE[2]._2_1_;
              cStack_fd = vE[2]._3_1_;
              cStack_fc = vE[2]._4_1_;
              cStack_fb = vE[2]._5_1_;
              cStack_fa = vE[2]._6_1_;
              cStack_f9 = vE[2]._7_1_;
              vSaturationCheckMax[1] =
                   CONCAT17((cStack_101 < cStack_f1) * cStack_101 |
                            (cStack_101 >= cStack_f1) * cStack_f1,
                            CONCAT16((cStack_102 < cStack_f2) * cStack_102 |
                                     (cStack_102 >= cStack_f2) * cStack_f2,
                                     CONCAT15((cStack_103 < cStack_f3) * cStack_103 |
                                              (cStack_103 >= cStack_f3) * cStack_f3,
                                              CONCAT14((cStack_104 < cStack_f4) * cStack_104 |
                                                       (cStack_104 >= cStack_f4) * cStack_f4,
                                                       CONCAT13((cStack_105 < cStack_f5) *
                                                                cStack_105 |
                                                                (cStack_105 >= cStack_f5) *
                                                                cStack_f5,
                                                                CONCAT12((cStack_106 < cStack_f6) *
                                                                         cStack_106 |
                                                                         (cStack_106 >= cStack_f6) *
                                                                         cStack_f6,
                                                                         CONCAT11((cStack_107 <
                                                                                  cStack_f7) *
                                                                                  cStack_107 |
                                                                                  (cStack_107 >=
                                                                                  cStack_f7) *
                                                                                  cStack_f7,
                                                                                  ((char)vE[1] <
                                                                                  local_f8) *
                                                                                  (char)vE[1] |
                                                                                  ((char)vE[1] >=
                                                                                  local_f8) *
                                                                                  local_f8)))))));
              vSaturationCheckMin[0] =
                   CONCAT17((cStack_f9 < cStack_e9) * cStack_f9 |
                            (cStack_f9 >= cStack_e9) * cStack_e9,
                            CONCAT16((cStack_fa < cStack_ea) * cStack_fa |
                                     (cStack_fa >= cStack_ea) * cStack_ea,
                                     CONCAT15((cStack_fb < cStack_eb) * cStack_fb |
                                              (cStack_fb >= cStack_eb) * cStack_eb,
                                              CONCAT14((cStack_fc < cStack_ec) * cStack_fc |
                                                       (cStack_fc >= cStack_ec) * cStack_ec,
                                                       CONCAT13((cStack_fd < cStack_ed) * cStack_fd
                                                                | (cStack_fd >= cStack_ed) *
                                                                  cStack_ed,
                                                                CONCAT12((cStack_fe < cStack_ee) *
                                                                         cStack_fe |
                                                                         (cStack_fe >= cStack_ee) *
                                                                         cStack_ee,
                                                                         CONCAT11((cStack_ff <
                                                                                  cStack_ef) *
                                                                                  cStack_ff |
                                                                                  (cStack_ff >=
                                                                                  cStack_ef) *
                                                                                  cStack_ef,
                                                                                  (cStack_100 <
                                                                                  cStack_f0) *
                                                                                  cStack_100 |
                                                                                  (cStack_100 >=
                                                                                  cStack_f0) *
                                                                                  cStack_f0)))))));
              local_318 = (char)vNegInf[1];
              cStack_317 = (char)((ulong)vNegInf[1] >> 8);
              cStack_316 = (char)((ulong)vNegInf[1] >> 0x10);
              cStack_315 = (char)((ulong)vNegInf[1] >> 0x18);
              cStack_314 = (char)((ulong)vNegInf[1] >> 0x20);
              cStack_313 = (char)((ulong)vNegInf[1] >> 0x28);
              cStack_312 = (char)((ulong)vNegInf[1] >> 0x30);
              cStack_311 = (char)((ulong)vNegInf[1] >> 0x38);
              cStack_310 = (char)vSaturationCheckMax[0];
              cStack_30f = (char)((ulong)vSaturationCheckMax[0] >> 8);
              cStack_30e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
              cStack_30d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
              cStack_30c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
              cStack_30b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
              cStack_30a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
              cStack_309 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
              vNegInf[1] = CONCAT17((cStack_311 < cStack_101) * cStack_101 |
                                    (cStack_311 >= cStack_101) * cStack_311,
                                    CONCAT16((cStack_312 < cStack_102) * cStack_102 |
                                             (cStack_312 >= cStack_102) * cStack_312,
                                             CONCAT15((cStack_313 < cStack_103) * cStack_103 |
                                                      (cStack_313 >= cStack_103) * cStack_313,
                                                      CONCAT14((cStack_314 < cStack_104) *
                                                               cStack_104 |
                                                               (cStack_314 >= cStack_104) *
                                                               cStack_314,
                                                               CONCAT13((cStack_315 < cStack_105) *
                                                                        cStack_105 |
                                                                        (cStack_315 >= cStack_105) *
                                                                        cStack_315,
                                                                        CONCAT12((cStack_316 <
                                                                                 cStack_106) *
                                                                                 cStack_106 |
                                                                                 (cStack_316 >=
                                                                                 cStack_106) *
                                                                                 cStack_316,
                                                                                 CONCAT11((
                                                  cStack_317 < cStack_107) * cStack_107 |
                                                  (cStack_317 >= cStack_107) * cStack_317,
                                                  (local_318 < (char)vE[1]) * (char)vE[1] |
                                                  (local_318 >= (char)vE[1]) * local_318)))))));
              vSaturationCheckMax[0] =
                   CONCAT17((cStack_309 < cStack_f9) * cStack_f9 |
                            (cStack_309 >= cStack_f9) * cStack_309,
                            CONCAT16((cStack_30a < cStack_fa) * cStack_fa |
                                     (cStack_30a >= cStack_fa) * cStack_30a,
                                     CONCAT15((cStack_30b < cStack_fb) * cStack_fb |
                                              (cStack_30b >= cStack_fb) * cStack_30b,
                                              CONCAT14((cStack_30c < cStack_fc) * cStack_fc |
                                                       (cStack_30c >= cStack_fc) * cStack_30c,
                                                       CONCAT13((cStack_30d < cStack_fd) * cStack_fd
                                                                | (cStack_30d >= cStack_fd) *
                                                                  cStack_30d,
                                                                CONCAT12((cStack_30e < cStack_fe) *
                                                                         cStack_fe |
                                                                         (cStack_30e >= cStack_fe) *
                                                                         cStack_30e,
                                                                         CONCAT11((cStack_30f <
                                                                                  cStack_ff) *
                                                                                  cStack_ff |
                                                                                  (cStack_30f >=
                                                                                  cStack_ff) *
                                                                                  cStack_30f,
                                                                                  (cStack_310 <
                                                                                  cStack_100) *
                                                                                  cStack_100 |
                                                                                  (cStack_310 >=
                                                                                  cStack_100) *
                                                                                  cStack_310)))))));
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_900;
            vWH_00[1]._4_4_ = 0;
            arr_store_rowcol(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,
                             ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_col,vWH_00
                             ,end_ref,s2Len,(int32_t)(piVar31 + iVar15 * local_a94),(int32_t)piVar60
                            );
            ptr_00[(long)(end_ref + -0xf) + 0xf] = (char)vE[1];
            ptr_01[(long)(end_ref + -0xf) + 0xf] = (int8_t)vJ[1];
            local_1f8 = (char)vJreset[1];
            cStack_1f7 = vJreset[1]._1_1_;
            cStack_1f6 = vJreset[1]._2_1_;
            cStack_1f5 = vJreset[1]._3_1_;
            cStack_1f4 = vJreset[1]._4_1_;
            cStack_1f3 = vJreset[1]._5_1_;
            cStack_1f2 = vJreset[1]._6_1_;
            cStack_1f1 = vJreset[1]._7_1_;
            cStack_1f0 = (char)vJreset[2];
            cStack_1ef = vJreset[2]._1_1_;
            cStack_1ee = vJreset[2]._2_1_;
            cStack_1ed = vJreset[2]._3_1_;
            cStack_1ec = vJreset[2]._4_1_;
            cStack_1eb = vJreset[2]._5_1_;
            cStack_1ea = vJreset[2]._6_1_;
            cStack_1e9 = vJreset[2]._7_1_;
            local_208 = auVar64[0];
            cStack_207 = auVar64[1];
            cStack_206 = auVar64[2];
            cStack_205 = auVar64[3];
            cStack_204 = auVar64[4];
            cStack_203 = auVar64[5];
            cStack_202 = auVar64[6];
            cStack_201 = auVar64[7];
            cStack_200 = auVar64[8];
            cStack_1ff = auVar64[9];
            cStack_1fe = auVar64[10];
            cStack_1fd = auVar64[0xb];
            cStack_1fc = auVar64[0xc];
            cStack_1fb = auVar64[0xd];
            cStack_1fa = auVar64[0xe];
            cStack_1f9 = auVar64[0xf];
            local_228 = auVar65[0];
            cStack_227 = auVar65[1];
            cStack_226 = auVar65[2];
            cStack_225 = auVar65[3];
            cStack_224 = auVar65[4];
            cStack_223 = auVar65[5];
            cStack_222 = auVar65[6];
            cStack_221 = auVar65[7];
            cStack_220 = auVar65[8];
            cStack_21f = auVar65[9];
            cStack_21e = auVar65[10];
            cStack_21d = auVar65[0xb];
            cStack_21c = auVar65[0xc];
            cStack_21b = auVar65[0xd];
            cStack_21a = auVar65[0xe];
            cStack_219 = auVar65[0xf];
            auVar48._8_8_ =
                 CONCAT17(-(cStack_1e9 == cStack_1f9),
                          CONCAT16(-(cStack_1ea == cStack_1fa),
                                   CONCAT15(-(cStack_1eb == cStack_1fb),
                                            CONCAT14(-(cStack_1ec == cStack_1fc),
                                                     CONCAT13(-(cStack_1ed == cStack_1fd),
                                                              CONCAT12(-(cStack_1ee == cStack_1fe),
                                                                       CONCAT11(-(cStack_1ef ==
                                                                                 cStack_1ff),
                                                                                -(cStack_1f0 ==
                                                                                 cStack_200))))))))
                 & CONCAT17(-(cStack_1c9 == cStack_219),
                            CONCAT16(-(cStack_1ca == cStack_21a),
                                     CONCAT15(-(cStack_1cb == cStack_21b),
                                              CONCAT14(-(cStack_1cc == cStack_21c),
                                                       CONCAT13(-(cStack_1cd == cStack_21d),
                                                                CONCAT12(-(cStack_1ce == cStack_21e)
                                                                         ,CONCAT11(-(cStack_1cf ==
                                                                                    cStack_21f),
                                                                                   -(cStack_1d0 ==
                                                                                    cStack_220))))))
                                    ));
            auVar48._0_8_ =
                 CONCAT17(-(cStack_1f1 == cStack_201),
                          CONCAT16(-(cStack_1f2 == cStack_202),
                                   CONCAT15(-(cStack_1f3 == cStack_203),
                                            CONCAT14(-(cStack_1f4 == cStack_204),
                                                     CONCAT13(-(cStack_1f5 == cStack_205),
                                                              CONCAT12(-(cStack_1f6 == cStack_206),
                                                                       CONCAT11(-(cStack_1f7 ==
                                                                                 cStack_207),
                                                                                -(local_1f8 ==
                                                                                 local_208)))))))) &
                 CONCAT17(-(cStack_1d1 == cStack_221),
                          CONCAT16(-(cStack_1d2 == cStack_222),
                                   CONCAT15(-(cStack_1d3 == cStack_223),
                                            CONCAT14(-(cStack_1d4 == cStack_224),
                                                     CONCAT13(-(cStack_1d5 == cStack_225),
                                                              CONCAT12(-(cStack_1d6 == cStack_226),
                                                                       CONCAT11(-(cStack_1d7 ==
                                                                                 cStack_227),
                                                                                -(local_1d8 ==
                                                                                 local_228))))))));
            register0x00001240 = pblendvb(stack0xfffffffffffff888,register0x00001240,auVar48);
            auVar46._8_8_ = 0x101010101010101;
            auVar46._0_8_ = 0x101010101010101;
            _matrow0 = paddsb(_matrow0,auVar46);
            unique0x10004607 = auVar45;
          }
          auVar45._8_8_ = 0x1010101010101010;
          auVar45._0_8_ = 0x1010101010101010;
          register0x00001200 = paddsb(stack0xfffffffffffff8a8,auVar45);
          register0x00001200 = psubsb(stack0xfffffffffffff838,auVar38);
        }
        vNegLimit[1]._5_1_ = cVar58;
        for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
          if (vNegLimit[1]._5_1_ < vMax[0]._7_1_) {
            vNegLimit[1]._5_1_ = vMax[0]._7_1_;
          }
          vMax[0] = vMax[0] << 8 | (ulong)vILimit[1] >> 0x38;
          vILimit[1] = vILimit[1] << 8;
        }
        local_78 = (char)vSaturationCheckMax[1];
        cStack_77 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_76 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_75 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_74 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_73 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_72 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_71 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_70 = (char)vSaturationCheckMin[0];
        cStack_6f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_6e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_6d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_6c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_6b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_6a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_69 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_48 = (char)vNegInf[1];
        cStack_47 = (char)((ulong)vNegInf[1] >> 8);
        cStack_46 = (char)((ulong)vNegInf[1] >> 0x10);
        cStack_45 = (char)((ulong)vNegInf[1] >> 0x18);
        cStack_44 = (char)((ulong)vNegInf[1] >> 0x20);
        cStack_43 = (char)((ulong)vNegInf[1] >> 0x28);
        cStack_42 = (char)((ulong)vNegInf[1] >> 0x30);
        cStack_41 = (char)((ulong)vNegInf[1] >> 0x38);
        cStack_40 = (char)vSaturationCheckMax[0];
        cStack_3f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_3e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_3d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_3c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_3b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_3a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_39 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar91 = CONCAT17(-(cStack_69 < cVar58),
                          CONCAT16(-(cStack_6a < cVar58),
                                   CONCAT15(-(cStack_6b < cVar58),
                                            CONCAT14(-(cStack_6c < cVar58),
                                                     CONCAT13(-(cStack_6d < cVar58),
                                                              CONCAT12(-(cStack_6e < cVar58),
                                                                       CONCAT11(-(cStack_6f < cVar58
                                                                                 ),-(cStack_70 <
                                                                                    cVar58)))))))) |
                 CONCAT17(-(cVar59 < cStack_39),
                          CONCAT16(-(cVar59 < cStack_3a),
                                   CONCAT15(-(cVar59 < cStack_3b),
                                            CONCAT14(-(cVar59 < cStack_3c),
                                                     CONCAT13(-(cVar59 < cStack_3d),
                                                              CONCAT12(-(cVar59 < cStack_3e),
                                                                       CONCAT11(-(cVar59 < cStack_3f
                                                                                 ),-(cVar59 < 
                                                  cStack_40))))))));
        auVar57._8_8_ = uVar91;
        auVar57._0_8_ =
             CONCAT17(-(cStack_71 < cVar58),
                      CONCAT16(-(cStack_72 < cVar58),
                               CONCAT15(-(cStack_73 < cVar58),
                                        CONCAT14(-(cStack_74 < cVar58),
                                                 CONCAT13(-(cStack_75 < cVar58),
                                                          CONCAT12(-(cStack_76 < cVar58),
                                                                   CONCAT11(-(cStack_77 < cVar58),
                                                                            -(local_78 < cVar58)))))
                                       ))) |
             CONCAT17(-(cVar59 < cStack_41),
                      CONCAT16(-(cVar59 < cStack_42),
                               CONCAT15(-(cVar59 < cStack_43),
                                        CONCAT14(-(cVar59 < cStack_44),
                                                 CONCAT13(-(cVar59 < cStack_45),
                                                          CONCAT12(-(cVar59 < cStack_46),
                                                                   CONCAT11(-(cVar59 < cStack_47),
                                                                            -(cVar59 < local_48)))))
                                       )));
        if ((((((((((((((((auVar57 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar57 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar57 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar57 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar57 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar57 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar91 >> 7 & 1) != 0) || (uVar91 >> 0xf & 1) != 0) || (uVar91 >> 0x17 & 1) != 0)
               || (uVar91 >> 0x1f & 1) != 0) || (uVar91 >> 0x27 & 1) != 0) ||
             (uVar91 >> 0x2f & 1) != 0) || (uVar91 >> 0x37 & 1) != 0) || (long)uVar91 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._5_1_ = '\0';
          iStack_68c = 0;
          local_690 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)vNegLimit[1]._5_1_;
        ((parasail_result_t *)_s1_local)->end_query = iStack_68c;
        ((parasail_result_t *)_s1_local)->end_ref = local_690;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi8(NEG_LIMIT);
    vOpen = _mm_set1_epi8(open);
    vGap  = _mm_set1_epi8(gap);
    vOne = _mm_set1_epi8(1);
    vN = _mm_set1_epi8(N);
    vGapN = _mm_set1_epi8(gap*N);
    vNegOne = _mm_set1_epi8(-1);
    vI = _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm_set_epi8(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMax = vNegInf;
    vILimit = _mm_set1_epi8(s1Len);
    vILimit1 = _mm_subs_epi8(vILimit, vOne);
    vJLimit = _mm_set1_epi8(s2Len);
    vJLimit1 = _mm_subs_epi8(vJLimit, vOne);
    vIBoundary = _mm_set_epi8(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        vNH = _mm_srli_si128(vNH, 1);
        vNH = _mm_insert_epi8(vNH, H_pr[-1], 15);
        vWH = _mm_srli_si128(vWH, 1);
        vWH = _mm_insert_epi8(vWH, -open - i*gap, 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 1);
            vNH = _mm_insert_epi8(vNH, H_pr[j], 15);
            vF = _mm_srli_si128(vF, 1);
            vF = _mm_insert_epi8(vF, F_pr[j], 15);
            vF = _mm_max_epi8(
                    _mm_subs_epi8(vNH, vOpen),
                    _mm_subs_epi8(vF, vGap));
            vE = _mm_max_epi8(
                    _mm_subs_epi8(vWH, vOpen),
                    _mm_subs_epi8(vE, vGap));
            vMat = _mm_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm_adds_epi8(vNWH, vMat);
            vWH = _mm_max_epi8(vNWH, vE);
            vWH = _mm_max_epi8(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi8(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int8_t)_mm_extract_epi8(vWH,0);
            F_pr[j-15] = (int8_t)_mm_extract_epi8(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi8(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi8(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi8(vJ, vOne);
        }
        vI = _mm_adds_epi8(vI, vN);
        vIBoundary = _mm_subs_epi8(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int8_t value;
        value = (int8_t) _mm_extract_epi8(vMax, 15);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}